

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BraIA64.c
# Opt level: O0

SizeT IA64_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  UInt32 dest;
  UInt32 src;
  int j;
  UInt64 instNorm;
  UInt64 instruction;
  UInt32 bitRes;
  UInt32 bytePos;
  int slot;
  UInt32 bitPos;
  UInt32 mask;
  UInt32 instrTemplate;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  SizeT local_8;
  
  if (size < 0x10) {
    local_8 = 0;
  }
  else {
    for (i = 0; i <= size - 0x10; i = i + 0x10) {
      bVar1 = ""[data[i] & 0x1f];
      bitPos = 5;
      for (slot = 0; slot < 3; slot = slot + 1) {
        if ((bVar1 >> ((byte)slot & 0x1f) & 1) != 0) {
          bVar4 = (byte)bitPos & 7;
          instruction = 0;
          for (j = 0; j < 6; j = j + 1) {
            instruction = ((ulong)data[i + (long)j + (ulong)(bitPos >> 3)] <<
                          ((byte)(j << 3) & 0x3f)) + instruction;
          }
          uVar3 = instruction >> bVar4;
          if (((uVar3 >> 0x25 & 0xf) == 5) && ((uVar3 >> 9 & 7) == 0)) {
            if (encoding == 0) {
              iVar2 = -(ip + (int)i);
            }
            else {
              iVar2 = ip + (int)i;
            }
            dest = iVar2 + (((uint)(uVar3 >> 0x24) & 1) << 0x14 | (uint)(uVar3 >> 0xd) & 0xfffff) *
                           0x10;
            for (j = 0; j < 6; j = j + 1) {
              data[i + (long)j + (ulong)(bitPos >> 3)] =
                   (Byte)((((ulong)(dest >> 4 & 0x100000) << 0x10 |
                           (ulong)(dest >> 4 & 0xfffff) << 0xd | uVar3 & 0xffffffee00001fff) <<
                           bVar4 | (long)((1 << bVar4) + -1) & instruction) >>
                         ((byte)(j << 3) & 0x3f));
            }
          }
        }
        bitPos = bitPos + 0x29;
      }
    }
    local_8 = i;
  }
  return local_8;
}

Assistant:

SizeT IA64_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 16)
    return 0;
  size -= 16;
  for (i = 0; i <= size; i += 16)
  {
    UInt32 instrTemplate = data[i] & 0x1F;
    UInt32 mask = kBranchTable[instrTemplate];
    UInt32 bitPos = 5;
    int slot;
    for (slot = 0; slot < 3; slot++, bitPos += 41)
    {
      UInt32 bytePos, bitRes;
      UInt64 instruction, instNorm;
      int j;
      if (((mask >> slot) & 1) == 0)
        continue;
      bytePos = (bitPos >> 3);
      bitRes = bitPos & 0x7;
      instruction = 0;
      for (j = 0; j < 6; j++)
        instruction += (UInt64)data[i + j + bytePos] << (8 * j);

      instNorm = instruction >> bitRes;
      if (((instNorm >> 37) & 0xF) == 0x5 && ((instNorm >> 9) & 0x7) == 0)
      {
        UInt32 src = (UInt32)((instNorm >> 13) & 0xFFFFF);
        UInt32 dest;
        src |= ((UInt32)(instNorm >> 36) & 1) << 20;
        
        src <<= 4;
        
        if (encoding)
          dest = ip + (UInt32)i + src;
        else
          dest = src - (ip + (UInt32)i);
        
        dest >>= 4;
        
        instNorm &= ~((UInt64)(0x8FFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0xFFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0x100000) << (36 - 20));
        
        instruction &= (1 << bitRes) - 1;
        instruction |= (instNorm << bitRes);
        for (j = 0; j < 6; j++)
          data[i + j + bytePos] = (Byte)(instruction >> (8 * j));
      }
    }
  }
  return i;
}